

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.cc
# Opt level: O2

int main(void)

{
  double dVar1;
  ostream *poVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  bool bVar7;
  parameter_type P;
  result_type local_190;
  vector<double,_std::allocator<double>_> x2;
  vector<double,_std::allocator<double>_> x1;
  vector<double,_std::allocator<double>_> x4;
  vector<double,_std::allocator<double>_> x3;
  lcg64 R;
  correlated_normal_dist<double> D;
  double sig [4] [4];
  double local_38;
  
  lVar3 = 0x10;
  pdVar4 = (double *)&DAT_001031c0;
  pdVar5 = sig[0];
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar5 = *pdVar4;
    pdVar4 = pdVar4 + 1;
    pdVar5 = pdVar5 + 1;
  }
  trng::correlated_normal_dist<double>::correlated_normal_dist<double_const*>(&D,sig[0],&local_38);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64::lcg64(&R,P);
  x1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  x2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  x1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  x2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  x3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  x3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  x4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  x4.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar6 = 1000000;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    local_190 = trng::correlated_normal_dist<double>::operator()(&D,&R);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&x1,&local_190);
    local_190 = trng::correlated_normal_dist<double>::operator()(&D,&R);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&x2,&local_190);
    local_190 = trng::correlated_normal_dist<double>::operator()(&D,&R);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&x3,&local_190);
    local_190 = trng::correlated_normal_dist<double>::operator()(&D,&R);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&x4,&local_190);
  }
  *(undefined8 *)(erf + *(long *)(std::cout + -0x18)) = 4;
  dVar1 = covariance(&x1,&x1);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x1,&x2);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x1,&x3);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x1,&x4);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\n');
  dVar1 = covariance(&x2,&x1);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x2,&x2);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x2,&x3);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x2,&x4);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\n');
  dVar1 = covariance(&x3,&x1);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x3,&x2);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x3,&x3);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x3,&x4);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\n');
  dVar1 = covariance(&x4,&x1);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x4,&x2);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x4,&x3);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\t');
  dVar1 = covariance(&x4,&x4);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar2,'\n');
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x4.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x3.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x1.super__Vector_base<double,_std::allocator<double>_>);
  trng::correlated_normal_dist<double>::~correlated_normal_dist(&D);
  return 0;
}

Assistant:

int main() {
  const int d{4};
  // covariance matrix
  const double sig[d][d]{{2.0, -0.5, 0.3, -0.3},
                         {-0.5, 3.0, -0.3, 0.3},
                         {0.3, -0.3, 1.0, -0.3},
                         {-0.3, 0.3, -0.3, 1.0}};
  trng::correlated_normal_dist<> D(&sig[0][0], &sig[d - 1][d - 1] + 1);
  trng::lcg64 R;

  std::vector<double> x1, x2, x3, x4;
  // generate 4-tuples of correlated normal variables
  for (int i{0}; i < 1000000; ++i) {
    x1.push_back(D(R));
    x2.push_back(D(R));
    x3.push_back(D(R));
    x4.push_back(D(R));
  }
  // print (empirical) covariance matrix
  std::cout << std::setprecision(4) << covariance(x1, x1) << '\t' << covariance(x1, x2) << '\t'
            << covariance(x1, x3) << '\t' << covariance(x1, x4) << '\n'
            << covariance(x2, x1) << '\t' << covariance(x2, x2) << '\t' << covariance(x2, x3)
            << '\t' << covariance(x2, x4) << '\n'
            << covariance(x3, x1) << '\t' << covariance(x3, x2) << '\t' << covariance(x3, x3)
            << '\t' << covariance(x3, x4) << '\n'
            << covariance(x4, x1) << '\t' << covariance(x4, x2) << '\t' << covariance(x4, x3)
            << '\t' << covariance(x4, x4) << '\n';
  return EXIT_SUCCESS;
}